

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrShadingContext.hpp
# Opt level: O2

Vector<float,_4> __thiscall
rr::readVarying<float>
          (rr *this,FragmentPacket *packet,FragmentShadingContext *context,int varyingLoc,
          int fragNdx)

{
  GenericVec4 *pGVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  float fVar4;
  undefined8 in_XMM1_Qa;
  Vector<float,_4> VVar6;
  float fVar5;
  
  if (context->varyings[1] == (GenericVec4 *)0x0) {
    pGVar1 = context->varyings[0] + varyingLoc;
    fVar4 = (float)(pGVar1->v).uData[0];
    fVar5 = (float)(pGVar1->v).uData[1];
    dVar2 = (pGVar1->v).uData[2];
    dVar3 = (pGVar1->v).uData[3];
    *(float *)this = fVar4;
    *(float *)(this + 4) = fVar5;
    *(deUint32 *)(this + 8) = dVar2;
    *(deUint32 *)(this + 0xc) = dVar3;
  }
  else if (context->varyings[2] == (GenericVec4 *)0x0) {
    VVar6 = readLineVarying<float>(this,packet,context,varyingLoc,fragNdx);
    in_XMM1_Qa = VVar6.m_data._8_8_;
    fVar4 = VVar6.m_data[0];
    fVar5 = VVar6.m_data[1];
  }
  else {
    VVar6 = readTriangleVarying<float>(this,packet,context,varyingLoc,fragNdx);
    in_XMM1_Qa = VVar6.m_data._8_8_;
    fVar4 = VVar6.m_data[0];
    fVar5 = VVar6.m_data[1];
  }
  VVar6.m_data[1] = fVar5;
  VVar6.m_data[0] = fVar4;
  VVar6.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar6.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  return (Vector<float,_4>)VVar6.m_data;
}

Assistant:

tcu::Vector<T, 4> readVarying (const FragmentPacket& packet, const FragmentShadingContext& context, int varyingLoc, int fragNdx)
{
	if (context.varyings[1] == DE_NULL)	return readPointVarying<T>		(packet, context, varyingLoc, fragNdx);
	if (context.varyings[2] == DE_NULL)	return readLineVarying<T>		(packet, context, varyingLoc, fragNdx);
										return readTriangleVarying<T>	(packet, context, varyingLoc, fragNdx);
}